

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O3

void __thiscall
t_php_generator::generate_serialize_field
          (t_php_generator *this,ostream *out,t_field *tfield,string *prefix)

{
  pointer pcVar1;
  pointer pcVar2;
  int iVar3;
  t_type *ttype;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  t_struct *tstruct;
  long lVar7;
  char *pcVar8;
  t_base_type *ptVar9;
  undefined1 auVar10 [12];
  string name;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ttype = t_type::get_true_type(tfield->type_);
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
  if ((char)iVar3 != '\0') {
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(&local_b0,"CANNOT GENERATE SERIALIZE CODE FOR void TYPE: ",prefix);
    std::operator+(pbVar6,&local_b0,&tfield->name_);
    __cxa_throw(pbVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
  if (((char)iVar3 != '\0') ||
     (iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype), (char)iVar3 != '\0')) {
    std::operator+(&local_50,prefix,&tfield->name_);
    generate_serialize_struct(this,out,tstruct,&local_50);
    paVar4 = &local_50.field_2;
    goto LAB_002fd12a;
  }
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
  if ((char)iVar3 != '\0') {
    std::operator+(&local_70,prefix,&tfield->name_);
    generate_serialize_container(this,out,ttype,&local_70);
    paVar4 = &local_70.field_2;
    goto LAB_002fd12a;
  }
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
  if (((char)iVar3 == '\0') &&
     (iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype), (char)iVar3 == '\0')) {
    pcVar1 = (prefix->_M_dataplus)._M_p;
    pcVar2 = (tfield->name_)._M_dataplus._M_p;
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
    printf("DO NOT KNOW HOW TO SERIALIZE FIELD \'%s%s\' TYPE \'%s\'\n",pcVar1,pcVar2,
           *(undefined8 *)CONCAT44(extraout_var,iVar3));
    return;
  }
  std::operator+(&local_b0,prefix,&tfield->name_);
  if (this->binary_inline_ == true) {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
      if ((char)iVar3 == '\0') goto LAB_002fd822;
      t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"$output .= pack(\'N\', $",0x16);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    else {
      ptVar9 = (t_base_type *)(ulong)*(uint *)&ttype[1].super_t_doc._vptr_t_doc;
      switch(ptVar9) {
      case (t_base_type *)0x0:
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
        std::operator+(pbVar6,"compiler error: cannot serialize void field in a struct: ",&local_b0)
        ;
        __cxa_throw(pbVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      case (t_base_type *)0x1:
        t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_d0._M_dataplus._M_p,local_d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"$output .= pack(\'N\', strlen($",0x1d);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"));",3);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"$output .= $",0xc);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        break;
      case (t_base_type *)0x2:
        t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_d0._M_dataplus._M_p,local_d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"$output .= pack(\'c\', $",0x16);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ? 1 : 0);",10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        break;
      case (t_base_type *)0x3:
        t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_d0._M_dataplus._M_p,local_d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"$output .= pack(\'c\', $",0x16);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        break;
      case (t_base_type *)0x4:
        t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_d0._M_dataplus._M_p,local_d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"$output .= pack(\'n\', $",0x16);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        break;
      case (t_base_type *)0x5:
        t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_d0._M_dataplus._M_p,local_d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"$output .= pack(\'N\', $",0x16);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        break;
      case (t_base_type *)0x6:
        t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_d0._M_dataplus._M_p,local_d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"$output .= pack(\'N2\', $",0x17);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," >> 32, $",9);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," & 0xFFFFFFFF);",0xf);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        break;
      case (t_base_type *)0x7:
        t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_d0._M_dataplus._M_p,local_d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"$output .= strrev(pack(\'d\', $",0x1d);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"));",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        break;
      default:
        auVar10 = __cxa_allocate_exception(0x20);
        t_base_type::t_base_name_abi_cxx11_(&local_d0,ptVar9,auVar10._8_4_);
        std::operator+(auVar10._0_8_,"compiler error: no PHP name for base type ",&local_d0);
        __cxa_throw(auVar10._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  else {
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"$xfer += $output->",0x12);
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
      if ((char)iVar3 != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(out,"writeI32($",10);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
      }
    }
    else {
      ptVar9 = (t_base_type *)(ulong)*(uint *)&ttype[1].super_t_doc._vptr_t_doc;
      lVar7 = 0xd;
      switch(ptVar9) {
      case (t_base_type *)0x0:
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
        std::operator+(pbVar6,"compiler error: cannot serialize void field in a struct: ",&local_b0)
        ;
        __cxa_throw(pbVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      case (t_base_type *)0x1:
        pcVar8 = "writeString($";
        break;
      case (t_base_type *)0x2:
        lVar7 = 0xb;
        pcVar8 = "writeBool($";
        break;
      case (t_base_type *)0x3:
        lVar7 = 0xb;
        pcVar8 = "writeByte($";
        break;
      case (t_base_type *)0x4:
        lVar7 = 10;
        pcVar8 = "writeI16($";
        break;
      case (t_base_type *)0x5:
        lVar7 = 10;
        pcVar8 = "writeI32($";
        break;
      case (t_base_type *)0x6:
        lVar7 = 10;
        pcVar8 = "writeI64($";
        break;
      case (t_base_type *)0x7:
        pcVar8 = "writeDouble($";
        break;
      default:
        auVar10 = __cxa_allocate_exception(0x20);
        t_base_type::t_base_name_abi_cxx11_(&local_d0,ptVar9,auVar10._8_4_);
        std::operator+(auVar10._0_8_,"compiler error: no PHP name for base type ",&local_d0);
        __cxa_throw(auVar10._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,pcVar8,lVar7);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
LAB_002fd822:
  paVar4 = &local_b0.field_2;
LAB_002fd12a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*(undefined1 **)(paVar4->_M_local_buf + -0x10) != paVar4) {
    operator_delete(*(undefined1 **)(paVar4->_M_local_buf + -0x10));
  }
  return;
}

Assistant:

void t_php_generator::generate_serialize_field(ostream& out, t_field* tfield, string prefix) {
  t_type* type = get_true_type(tfield->get_type());

  // Do nothing for void types
  if (type->is_void()) {
    throw "CANNOT GENERATE SERIALIZE CODE FOR void TYPE: " + prefix + tfield->get_name();
  }

  if (type->is_struct() || type->is_xception()) {
    generate_serialize_struct(out, (t_struct*)type, prefix + tfield->get_name());
  } else if (type->is_container()) {
    generate_serialize_container(out, type, prefix + tfield->get_name());
  } else if (type->is_base_type() || type->is_enum()) {

    string name = prefix + tfield->get_name();

    if (binary_inline_) {
      if (type->is_base_type()) {
        t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
        switch (tbase) {
        case t_base_type::TYPE_VOID:
          throw "compiler error: cannot serialize void field in a struct: " + name;
          break;
        case t_base_type::TYPE_STRING:
          out << indent() << "$output .= pack('N', strlen($" << name << "));" << endl << indent()
              << "$output .= $" << name << ";" << endl;
          break;
        case t_base_type::TYPE_BOOL:
          out << indent() << "$output .= pack('c', $" << name << " ? 1 : 0);" << endl;
          break;
        case t_base_type::TYPE_I8:
          out << indent() << "$output .= pack('c', $" << name << ");" << endl;
          break;
        case t_base_type::TYPE_I16:
          out << indent() << "$output .= pack('n', $" << name << ");" << endl;
          break;
        case t_base_type::TYPE_I32:
          out << indent() << "$output .= pack('N', $" << name << ");" << endl;
          break;
        case t_base_type::TYPE_I64:
          out << indent() << "$output .= pack('N2', $" << name << " >> 32, $" << name
              << " & 0xFFFFFFFF);" << endl;
          break;
        case t_base_type::TYPE_DOUBLE:
          out << indent() << "$output .= strrev(pack('d', $" << name << "));" << endl;
          break;
        default:
          throw "compiler error: no PHP name for base type " + t_base_type::t_base_name(tbase);
        }
      } else if (type->is_enum()) {
        out << indent() << "$output .= pack('N', $" << name << ");" << endl;
      }
    } else {

      indent(out) << "$xfer += $output->";

      if (type->is_base_type()) {
        t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
        switch (tbase) {
        case t_base_type::TYPE_VOID:
          throw "compiler error: cannot serialize void field in a struct: " + name;
          break;
        case t_base_type::TYPE_STRING:
          out << "writeString($" << name << ");";
          break;
        case t_base_type::TYPE_BOOL:
          out << "writeBool($" << name << ");";
          break;
        case t_base_type::TYPE_I8:
          out << "writeByte($" << name << ");";
          break;
        case t_base_type::TYPE_I16:
          out << "writeI16($" << name << ");";
          break;
        case t_base_type::TYPE_I32:
          out << "writeI32($" << name << ");";
          break;
        case t_base_type::TYPE_I64:
          out << "writeI64($" << name << ");";
          break;
        case t_base_type::TYPE_DOUBLE:
          out << "writeDouble($" << name << ");";
          break;
        default:
          throw "compiler error: no PHP name for base type " + t_base_type::t_base_name(tbase);
        }
      } else if (type->is_enum()) {
        out << "writeI32($" << name << ");";
      }
      out << endl;
    }
  } else {
    printf("DO NOT KNOW HOW TO SERIALIZE FIELD '%s%s' TYPE '%s'\n",
           prefix.c_str(),
           tfield->get_name().c_str(),
           type->get_name().c_str());
  }
}